

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

FileMetaData * __thiscall
leveldb::AddBoundaryInputsTest::CreateFileMetaData
          (AddBoundaryInputsTest *this,uint64_t number,InternalKey *smallest,InternalKey *largest)

{
  FileMetaData *this_00;
  FileMetaData *local_30;
  FileMetaData *f;
  InternalKey *largest_local;
  InternalKey *smallest_local;
  uint64_t number_local;
  AddBoundaryInputsTest *this_local;
  
  f = (FileMetaData *)largest;
  largest_local = smallest;
  smallest_local = (InternalKey *)number;
  number_local = (uint64_t)this;
  this_00 = (FileMetaData *)operator_new(0x58);
  FileMetaData::FileMetaData(this_00);
  this_00->number = (uint64_t)smallest_local;
  local_30 = this_00;
  InternalKey::operator=(&this_00->smallest,smallest);
  InternalKey::operator=(&local_30->largest,largest);
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
            (&this->all_files_,&local_30);
  return local_30;
}

Assistant:

FileMetaData* CreateFileMetaData(uint64_t number, InternalKey smallest,
                                   InternalKey largest) {
    FileMetaData* f = new FileMetaData();
    f->number = number;
    f->smallest = smallest;
    f->largest = largest;
    all_files_.push_back(f);
    return f;
  }